

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O3

void __thiscall cursespp::ToastOverlay::~ToastOverlay(ToastOverlay *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__ToastOverlay_001a8018;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&PTR__ToastOverlay_001a82a0;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__ToastOverlay_001a82d0;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ToastOverlay_001a82f8;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__ToastOverlay_001a8320;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ToastOverlay_001a83c8;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ToastOverlay_001a83f0;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ToastOverlay_001a8418;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ToastOverlay_001a8448;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay =
       (_func_int **)&PTR__ToastOverlay_001a8478;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__ToastOverlay_001a84a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->titleLines);
  pcVar2 = (this->title)._M_dataplus._M_p;
  paVar1 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  sigslot::has_slots<sigslot::multi_threaded_local>::~has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__OverlayBase_001a4a88;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&PTR__OverlayBase_001a4d10;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__OverlayBase_001a4d40;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__OverlayBase_001a4d68;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__OverlayBase_001a4d90;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__OverlayBase_001a4e38;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__OverlayBase_001a4e60;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__OverlayBase_001a4e88;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__OverlayBase_001a4eb8;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__OverlayBase_001a4ee8
  ;
  (this->super_OverlayBase).stack = (OverlayStack *)0x0;
  LayoutBase::~LayoutBase((LayoutBase *)this);
  return;
}

Assistant:

ToastOverlay::~ToastOverlay() {
}